

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

ACT_TYPE __thiscall
despot::POMDPXGreedyActionPolicy::Action
          (POMDPXGreedyActionPolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  ACT_TYPE AVar2;
  int iVar3;
  int iVar4;
  pointer ppSVar5;
  State *prev_state;
  ulong uVar6;
  ACT_TYPE AVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar3 = (*(this->pomdpx_model_->super_MDP)._vptr_MDP[3])();
  if (iVar3 < 1) {
    AVar7 = 0;
  }
  else {
    dVar8 = -INFINITY;
    AVar7 = 0;
    iVar3 = 0;
    do {
      ppSVar5 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
          .super__Vector_impl_data._M_finish == ppSVar5) {
        dVar10 = 0.0;
      }
      else {
        dVar10 = 0.0;
        uVar6 = 0;
        do {
          dVar1 = ppSVar5[uVar6]->weight;
          prev_state = ppSVar5[uVar6] + 1;
          dVar9 = Parser::GetReward(this->pomdpx_model_->parser_,
                                    (vector<int,_std::allocator<int>_> *)prev_state,
                                    (vector<int,_std::allocator<int>_> *)prev_state,iVar3);
          dVar10 = dVar10 + dVar9 * dVar1;
          uVar6 = uVar6 + 1;
          ppSVar5 = (particles->
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(particles->
                                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5
                                >> 3));
      }
      AVar2 = iVar3;
      if (dVar10 <= dVar8) {
        dVar10 = dVar8;
        AVar2 = AVar7;
      }
      AVar7 = AVar2;
      dVar8 = dVar10;
      iVar3 = iVar3 + 1;
      iVar4 = (*(this->pomdpx_model_->super_MDP)._vptr_MDP[3])();
    } while (iVar3 < iVar4);
  }
  return AVar7;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		ACT_TYPE bestAction = 0;
		double maxReward = Globals::NEG_INFTY;
		for (ACT_TYPE action = 0; action < pomdpx_model_->NumActions(); action++) {
			double reward = 0;
			for (int i = 0; i < particles.size(); i++) {
				State* particle = particles[i];
				POMDPXState* state = static_cast<POMDPXState*>(particle);
				reward += state->weight
					* pomdpx_model_->parser_->GetReward(state->vec_id,
						state->vec_id, action);
			}
			if (reward > maxReward) {
				maxReward = reward;
				bestAction = action;
			}
		}
		return bestAction;
	}